

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O0

void duckdb::ParquetDecodeUtils::Skip
               (ByteBuffer *src,bitpacking_width_t *bitpack_pos,idx_t count,bitpacking_width_t width
               )

{
  char in_CL;
  ulong in_RDX;
  byte *in_RSI;
  ByteBuffer *in_RDI;
  idx_t i;
  idx_t aligned_count;
  idx_t remainder;
  undefined7 in_stack_00000018;
  undefined8 local_38;
  uint64_t in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined8 local_18;
  
  CheckWidth(remainder._7_1_);
  ByteBuffer::available
            ((ByteBuffer *)CONCAT17(in_CL,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  local_18 = in_RDX;
  if ((*in_RSI == 0) && (0x1f < in_RDX)) {
    local_18 = in_RDX & 0x1f;
    SkipAligned((ByteBuffer *)count,CONCAT17(width,in_stack_00000018),remainder._7_1_);
  }
  for (local_38 = 0; local_38 < local_18; local_38 = local_38 + 1) {
    *in_RSI = *in_RSI + in_CL;
    while (8 < *in_RSI) {
      ByteBuffer::unsafe_inc(in_RDI,1);
      *in_RSI = *in_RSI - 8;
    }
  }
  return;
}

Assistant:

static void Skip(ByteBuffer &src, bitpacking_width_t &bitpack_pos, idx_t count, const bitpacking_width_t width) {
		CheckWidth(width);
		src.available(count * width / BITPACK_DLEN); // check if buffer has enough space available once
		if (bitpack_pos == 0 && count >= BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE) {
			idx_t remainder = count % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;
			idx_t aligned_count = count - remainder;
			SkipAligned(src, aligned_count, width);
			count = remainder;
		}
		// FIXME: we should be able to just do this in one go instead of having this loop
		for (idx_t i = 0; i < count; i++) {
			bitpack_pos += width;
			while (bitpack_pos > BITPACK_DLEN) {
				src.unsafe_inc(1);
				bitpack_pos -= BITPACK_DLEN;
			}
		}
	}